

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream.h
# Opt level: O0

void fmt::v5::internal::format_value<wchar_t,Date>(basic_buffer<wchar_t> *buffer,Date *value)

{
  basic_buffer<wchar_t> *in_RDI;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> output;
  formatbuf<wchar_t> format_buf;
  basic_buffer<wchar_t> *in_stack_fffffffffffffe68;
  formatbuf<wchar_t> *in_stack_fffffffffffffe70;
  Date *d;
  wstreambuf *os;
  Date local_168 [22];
  wstreambuf local_58 [80];
  basic_buffer<wchar_t> *local_8;
  
  os = local_58;
  local_8 = in_RDI;
  formatbuf<wchar_t>::formatbuf(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  std::wostream::wostream(local_168,os);
  d = (Date *)((long)&local_168[0].year_ + *(long *)(local_168[0]._0_8_ + -0x18));
  std::operator|(_S_failbit,_S_badbit);
  std::wios::exceptions((_Ios_Iostate)d);
  ::operator<<((wostream *)os,d);
  basic_buffer<wchar_t>::size(local_8);
  basic_buffer<wchar_t>::resize(local_8,(size_t)in_stack_fffffffffffffe68);
  std::wostream::~wostream(local_168);
  formatbuf<wchar_t>::~formatbuf((formatbuf<wchar_t> *)0x16fe7e);
  return;
}

Assistant:

void format_value(basic_buffer<Char> &buffer, const T &value) {
  internal::formatbuf<Char> format_buf(buffer);
  std::basic_ostream<Char> output(&format_buf);
  output.exceptions(std::ios_base::failbit | std::ios_base::badbit);
  output << value;
  buffer.resize(buffer.size());
}